

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O3

_Bool createTree(tree_t *tree,uint numLeaves,uint dataSize)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  _Bool _Var4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint8_t *__ptr;
  bitset_word_t *__ptr_00;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  
  if (numLeaves == 0 || tree == (tree_t *)0x0) {
    return false;
  }
  uVar11 = (uint)(byte)-(char)LZCOUNT(numLeaves - 1);
  iVar9 = 2 << (uVar11 & 0x1f);
  iVar5 = -1 << (uVar11 & 0x1f);
  uVar11 = (numLeaves - 1) + iVar5 + iVar9;
  if (dataSize == 0) {
    __ptr = (uint8_t *)0x0;
  }
  else {
    __ptr = (uint8_t *)calloc((ulong)uVar11,(ulong)dataSize);
  }
  uVar10 = uVar11 * 2;
  uVar15 = (ulong)uVar10;
  tree->nodes = __ptr;
  __ptr_00 = (bitset_word_t *)calloc(uVar15 + 0x3f >> 6,8);
  tree->haveNodeExists = __ptr_00;
  if ((dataSize == 0 || __ptr != (uint8_t *)0x0) && (__ptr_00 != (bitset_word_t *)0x0)) {
    tree->depth = 0x21 - LZCOUNT(numLeaves - 1);
    tree->dataSize = dataSize;
    tree->numNodes = uVar11;
    tree->numLeaves = numLeaves;
    if (numLeaves == 0x10) {
      *__ptr_00 = 0x1555555555555555;
    }
    else {
      uVar3 = (uVar11 - numLeaves) * 2;
      uVar8 = (ulong)uVar3;
      uVar16 = uVar3;
      if ((uVar3 & 0x3e) != 0 && uVar3 < uVar10) {
        uVar16 = (iVar5 + iVar9) * 2 - 2;
        do {
          bVar2 = (byte)uVar8;
          uVar13 = uVar8 >> 6;
          uVar8 = uVar8 + 2;
          uVar16 = uVar16 + 2;
          __ptr_00[uVar13] = __ptr_00[uVar13] | 1L << (bVar2 & 0x3e);
          if (uVar15 <= uVar8) break;
        } while ((uVar8 & 0x3e) != 0);
      }
      uVar12 = uVar10 & 0xffffffc0;
      if (uVar16 < uVar12) {
        uVar6 = uVar16 + 0x40;
        if (uVar16 + 0x40 < uVar12) {
          uVar6 = uVar12;
        }
        memset(__ptr_00 + (uVar16 >> 6),0x55,(ulong)((uVar6 + ~uVar16 >> 6) * 8 + 8));
        uVar16 = uVar16 + 0x40 + (~uVar16 + uVar12 & 0xffffffc0);
      }
      if (uVar16 < uVar10) {
        uVar8 = (ulong)uVar16;
        do {
          bVar2 = (byte)uVar8;
          uVar13 = uVar8 >> 6;
          uVar8 = uVar8 + 2;
          __ptr_00[uVar13] = __ptr_00[uVar13] | 1L << (bVar2 & 0x3e);
        } while (uVar8 < uVar15);
      }
      if (uVar3 != 0) {
        iVar14 = 0;
        iVar7 = iVar5 * 2 + iVar9 * 2;
        uVar10 = (iVar5 + iVar9) * 4;
        do {
          if ((((uint)((iVar5 + iVar9) * 2 + -1 + iVar14) < uVar11) &&
              ((__ptr_00[uVar10 - 2 >> 6] >> (uVar10 - 2 & 0x3e) & 1) != 0)) ||
             (((uint)(iVar7 + iVar14) < uVar11 &&
              ((__ptr_00[uVar10 >> 6] >> (uVar10 & 0x3c) & 1) != 0)))) {
            uVar16 = iVar5 * 2 + -2 + iVar9 * 2 + iVar14;
            __ptr_00[uVar16 >> 6] = __ptr_00[uVar16 >> 6] | 1L << ((byte)uVar16 & 0x3e);
          }
          iVar1 = iVar7 + -2 + iVar14;
          uVar10 = uVar10 - 4;
          iVar14 = iVar14 + -2;
        } while (iVar1 != 2);
      }
      *(byte *)__ptr_00 = (byte)*__ptr_00 | 1;
    }
    _Var4 = true;
  }
  else {
    free(__ptr_00);
    free(__ptr);
    _Var4 = false;
  }
  return _Var4;
}

Assistant:

bool createTree(tree_t* tree, unsigned int numLeaves, unsigned int dataSize) {
  if (!tree || !numLeaves) {
    return false;
  }

  unsigned int depth = ceil_log2(numLeaves) + 1;
  /* Num nodes in complete - number of missing leaves */
  unsigned int num_nodes = ((1 << depth) - 1) - ((1 << (depth - 1)) - numLeaves);

  tree->nodes = dataSize ? calloc(num_nodes, dataSize) : NULL;
  /* Depending on the number of leaves, the tree may not be complete */
  tree->haveNodeExists =
      calloc((2 * num_nodes + sizeof(bitset_word_t) * 8 - 1) / (sizeof(bitset_word_t) * 8),
             sizeof(bitset_word_t));
  if ((dataSize && !tree->nodes) || !tree->haveNodeExists) {
    clearTree(tree);
    return false;
  }

  tree->depth     = depth;
  tree->dataSize  = dataSize;
  tree->numNodes  = num_nodes;
  tree->numLeaves = numLeaves;

  initNodes(tree);
  return true;
}